

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

char * PatchFormatStringFloatToInt(char *fmt)

{
  ImGuiContext_conflict *pIVar1;
  char *fmt_00;
  char *pcVar2;
  ImGuiContext *g;
  char *fmt_end;
  char *fmt_start;
  char *fmt_local;
  
  if ((((*fmt == '%') && (fmt[1] == '.')) && (fmt[2] == '0')) &&
     ((fmt[3] == 'f' && (fmt[4] == '\0')))) {
    fmt_local = "%d";
  }
  else {
    fmt_00 = ImParseFormatFindStart(fmt);
    pcVar2 = ImParseFormatFindEnd(fmt_00);
    pIVar1 = GImGui;
    fmt_local = fmt;
    if ((fmt_00 < pcVar2) && (pcVar2[-1] == 'f')) {
      if ((fmt_00 == fmt) && (*pcVar2 == '\0')) {
        fmt_local = "%d";
      }
      else {
        ImFormatString(GImGui->TempBuffer,0xc01,"%.*s%%d%s",(ulong)(uint)((int)fmt_00 - (int)fmt),
                       fmt,pcVar2);
        fmt_local = pIVar1->TempBuffer;
      }
    }
  }
  return fmt_local;
}

Assistant:

static const char* PatchFormatStringFloatToInt(const char* fmt)
{
    if (fmt[0] == '%' && fmt[1] == '.' && fmt[2] == '0' && fmt[3] == 'f' && fmt[4] == 0) // Fast legacy path for "%.0f" which is expected to be the most common case.
        return "%d";
    const char* fmt_start = ImParseFormatFindStart(fmt);    // Find % (if any, and ignore %%)
    const char* fmt_end = ImParseFormatFindEnd(fmt_start);  // Find end of format specifier, which itself is an exercise of confidence/recklessness (because snprintf is dependent on libc or user).
    if (fmt_end > fmt_start && fmt_end[-1] == 'f')
    {
#ifndef IMGUI_DISABLE_OBSOLETE_FUNCTIONS
        if (fmt_start == fmt && fmt_end[0] == 0)
            return "%d";
        ImGuiContext& g = *GImGui;
        ImFormatString(g.TempBuffer, IM_ARRAYSIZE(g.TempBuffer), "%.*s%%d%s", (int)(fmt_start - fmt), fmt, fmt_end); // Honor leading and trailing decorations, but lose alignment/precision.
        return g.TempBuffer;
#else
        IM_ASSERT(0 && "DragInt(): Invalid format string!"); // Old versions used a default parameter of "%.0f", please replace with e.g. "%d"
#endif
    }
    return fmt;
}